

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O1

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other)

{
  undefined8 *puVar1;
  ulong nbCols;
  long lVar2;
  undefined1 auVar3 [16];
  long lVar4;
  undefined8 *puVar5;
  Index index;
  ulong uVar6;
  undefined8 uVar7;
  long lVar8;
  bool bVar9;
  
  uVar6 = *(ulong *)(other + 8);
  nbCols = *(ulong *)(other + 0x10);
  bVar9 = nbCols == 0 || uVar6 == 0;
  if ((bVar9) ||
     (auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     uVar7 = SUB168(auVar3 % SEXT816((long)nbCols),0),
     (long)uVar6 <= SUB168(auVar3 / SEXT816((long)nbCols),0))) {
    if ((long)(nbCols | uVar6) < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/PlainObjectBase.h"
                    ,0xf1,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    if ((bVar9) ||
       (auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       uVar7 = SUB168(auVar3 % SEXT816((long)nbCols),0),
       (long)uVar6 <= SUB168(auVar3 / SEXT816((long)nbCols),0))) {
      DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)this,nbCols * uVar6,uVar6,nbCols);
      if ((*(long *)(this + 8) == *(long *)(other + 8)) &&
         (*(long *)(this + 0x10) == *(long *)(other + 0x10))) {
        lVar4 = *(long *)(this + 0x10) * *(long *)(this + 8);
        uVar6 = lVar4 - (lVar4 >> 0x3f) & 0xfffffffffffffffe;
        if (1 < lVar4) {
          lVar8 = 0;
          do {
            puVar5 = (undefined8 *)(*(long *)other + lVar8 * 8);
            uVar7 = puVar5[1];
            puVar1 = (undefined8 *)(*(long *)this + lVar8 * 8);
            *puVar1 = *puVar5;
            puVar1[1] = uVar7;
            lVar8 = lVar8 + 2;
          } while (lVar8 < (long)uVar6);
        }
        if ((long)uVar6 < lVar4) {
          lVar8 = *(long *)other;
          lVar2 = *(long *)this;
          do {
            *(undefined8 *)(lVar2 + uVar6 * 8) = *(undefined8 *)(lVar8 + uVar6 * 8);
            uVar6 = uVar6 + 1;
          } while (lVar4 - uVar6 != 0);
        }
        return (Matrix<double,__1,__1,_0,__1,__1> *)this;
      }
      __assert_fail("rows() == other.rows() && cols() == other.cols()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Assign.h"
                    ,0x1f9,
                    "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, -1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, -1>, OtherDerived = Eigen::Matrix<double, -1, -1>]"
                   );
    }
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8,bVar9,uVar7);
  *puVar5 = operator_delete;
  __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

EIGEN_STRONG_INLINE Derived& lazyAssign(const DenseBase<OtherDerived>& other)
    {
      _resize_to_match(other);
      return Base::lazyAssign(other.derived());
    }